

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Areal_Object_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Areal_Object_State_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pWVar3;
  string local_2e0 [32];
  __normal_iterator<const_KDIS::DATA_TYPE::WorldCoordinates_*,_std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>_>
  local_2c0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Areal_Object_State_PDU *local_18;
  Areal_Object_State_PDU *this_local;
  
  local_18 = this;
  this_local = (Areal_Object_State_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Areal Object State PDU-\n");
  Object_State_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_Object_State_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Modification:\n");
  poVar2 = std::operator<<(poVar2,"\tLocation: ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(byte)(this->super_Object_State_Header).field_0x4b & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Object Type: ");
  DATA_TYPE::ObjectType::GetAsString_abi_cxx11_(&local_210,&this->m_ObjTyp);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  DATA_TYPE::ArealObjectAppearance::GetAsString_abi_cxx11_(&local_230,&this->m_Apperance);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"Number Of Points: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumPoints);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Requestor ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_270,&this->m_ReqID);
  UTILS::IndentString(&local_250,&local_270,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"Receiving ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_((KString *)&citr,&this->m_RecvID);
  UTILS::IndentString(&local_290,(KString *)&citr,1,'\t');
  std::operator<<(poVar2,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
            ::begin(&this->m_vPoints);
  local_2c0._M_current =
       (WorldCoordinates *)
       std::
       vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
       ::end(&this->m_vPoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_2c0);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"Point Location: ");
    pWVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::WorldCoordinates_*,_std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>_>
             ::operator->(&citrEnd);
    (*(pWVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_2e0);
    std::operator<<(poVar2,local_2e0);
    std::__cxx11::string::~string(local_2e0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::WorldCoordinates_*,_std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Areal_Object_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Areal Object State PDU-\n"
       << Object_State_Header::GetAsString()
       << "Modification:\n"
       << "\tLocation: " << ( KUINT16 )m_ModificationUnion.m_ui8LocBit << "\n"
       << "Object Type: " << m_ObjTyp.GetAsString()
       << m_Apperance.GetAsString()
       << "Number Of Points: " << m_ui16NumPoints << "\n"
       << "Requestor ID:\n" << IndentString( m_ReqID.GetAsString(), 1 )
       << "Receiving ID:\n" << IndentString( m_RecvID.GetAsString(), 1 );

    vector<WorldCoordinates>::const_iterator citr = m_vPoints.begin();
    vector<WorldCoordinates>::const_iterator citrEnd = m_vPoints.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << "Point Location: " << citr->GetAsString();
    }

    return ss.str();
}